

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exls_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  u_char *__s;
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  u_char **ppuVar7;
  long lVar8;
  int iVar9;
  uint local_24f8;
  uint local_24f4;
  size_t outsz;
  uint local_24e4;
  MAFSA_automaton local_24e0;
  timeval tvs2;
  timeval tvs1;
  daciuk<256> dict;
  timeval tvc2;
  timeval tvc1;
  MAFSA_letter word [1024];
  
  MAFSA::daciuk<256>::daciuk(&dict);
  uVar5 = 0;
  for (ppuVar7 = urls; __s = *ppuVar7, __s != (u_char *)0x0; ppuVar7 = ppuVar7 + 1) {
    sVar2 = strlen((char *)__s);
    memcpy(word,__s,sVar2);
    gettimeofday((timeval *)&tvc1,(__timezone_ptr_t)0x0);
    MAFSA::daciuk<256>::insert(&dict,word,sVar2);
    gettimeofday((timeval *)&tvc2,(__timezone_ptr_t)0x0);
    uVar5 = uVar5 + ((int)tvc2.tv_usec - (int)tvc1.tv_usec) +
            ((int)tvc2.tv_sec - (int)tvc1.tv_sec) * 1000000;
  }
  MAFSA::daciuk<256>::save_to_file(&dict,"xxx");
  local_24e0 = MAFSA_automaton_load_from_binary_file("xxx",(int *)0x0);
  local_24f4 = 0;
  local_24f8 = 0;
  uVar6 = 0;
  while( true ) {
    outsz = 0;
    pcVar3 = fgets((char *)word,0x1000,_stdin);
    if (pcVar3 == (char *)0x0) break;
    pcVar3 = strchr((char *)word,10);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    pcVar3 = strchr((char *)word,0xd);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    sVar2 = strlen((char *)word);
    gettimeofday((timeval *)&tvs1,(__timezone_ptr_t)0x0);
    uVar4 = MAFSA_automaton_search(local_24e0,word,sVar2,(MAFSA_letter *)&tvc2,0x400,&outsz);
    gettimeofday((timeval *)&tvs2,(__timezone_ptr_t)0x0);
    uVar6 = uVar6 + ((int)tvs2.tv_usec - (int)tvs1.tv_usec) +
            ((int)tvs2.tv_sec - (int)tvs1.tv_sec) * 1000000;
    iVar9 = (int)uVar4;
    if (iVar9 == -1) {
      local_24f8 = local_24f8 + 1;
    }
    else {
      local_24f4 = local_24f4 + 1;
      snprintf((char *)&tvc1,(long)(iVar9 + 1),"%s",word);
      lVar8 = (long)iVar9;
      *(undefined8 *)((long)&tvc1.tv_sec + lVar8) = 0x6d31333b315b1b;
      local_24e4 = uVar6;
      snprintf((char *)((long)&tvc1.tv_sec + lVar8 + 7),outsz + 1,"%s",&tvc2);
      uVar6 = local_24e4;
      lVar1 = outsz + lVar8 + -0x2038;
      pcVar3 = (char *)((long)&tvc1.tv_usec + lVar1 + 0x203b);
      *(undefined4 *)((long)&tvc1.tv_sec + lVar1 + 0x203f) = 0x6d305b1b;
      *pcVar3 = '\0';
      snprintf(pcVar3,(sVar2 - (outsz + lVar8)) + 1,"%s",word + outsz + lVar8);
      printf("Filter (%03d .. %03u): %s\n",uVar4 & 0xffffffff,(ulong)(uint)(iVar9 + (int)outsz),
             &tvc1);
    }
  }
  putchar(10);
  printf("Result: ex = %d, ok = %d\n",(ulong)local_24f4,(ulong)local_24f8);
  printf("TimeComple: %6u.%06u seconds\n",(ulong)uVar5 / 1000000,(ulong)uVar5 % 1000000);
  printf("TimeSearch: %6u.%06u seconds\n",(ulong)uVar6 / 1000000,(ulong)uVar6 % 1000000);
  MAFSA_automaton_close(local_24e0);
  MAFSA::daciuk<256>::~daciuk(&dict);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    MAFSA::daciuk<MAX_LETTER + 1> dict;
    MAFSA_automaton ma;

    int i;
    int rc;

    uint32_t ex = 0, ok = 0;
    uint32_t cs = 0, ss = 0;

    for (i = 0; urls[i]; ++i)
    {
        size_t sz;
        MAFSA_letter word [1024];

        struct timeval tvc1;
        struct timeval tvc2;

        sz = strlen((const char *) urls[i]);
        memcpy(word, urls[i], sz);

        gettimeofday(&tvc1, NULL);
        dict.insert(word, sz);
        gettimeofday(&tvc2, NULL);

        cs += (tvc2.tv_sec - tvc1.tv_sec) * 1000000 + (tvc2.tv_usec - tvc1.tv_usec);
    }

    dict.save_to_file(SAVE_TO);
    ma = MAFSA_automaton_load_from_binary_file(SAVE_TO, NULL);

    for (;;)
    {
        MAFSA_letter outbuf [1024];
        char urlbuf [4096], *pos;
        size_t outsz = 0, urlsz = 0;

        struct timeval tvs1;
        struct timeval tvs2;

        if (NULL == fgets(urlbuf, 4096, stdin))
        {
            break;
        }

        if (NULL != (pos = strchr(urlbuf, '\n'))) *pos = 0;
        if (NULL != (pos = strchr(urlbuf, '\r'))) *pos = 0;

        urlsz = strlen(urlbuf);

        gettimeofday(&tvs1, NULL);
        rc = MAFSA_automaton_search(ma, (const MAFSA_letter *) urlbuf, urlsz, outbuf, 1024, &outsz);
        gettimeofday(&tvs2, NULL);

        ss += (tvs2.tv_sec - tvs1.tv_sec) * 1000000 + (tvs2.tv_usec - tvs1.tv_usec);

        if (-1 == rc)
        {
            ++ok;
        }
        else
        {
            char dbg [4096];

            ++ex;
            pos = dbg;

            snprintf(pos, rc + 1, "%s", urlbuf);
            pos += rc;

            snprintf(pos, sizeof("\033[1;31m"), "\033[1;31m");
            pos += sizeof("\033[1;31m") - 1;

            snprintf(pos, outsz + 1, "%s", outbuf);
            pos += outsz;

            snprintf(pos, sizeof("\033[0m"), "\033[0m");
            pos += sizeof("\033[0m") - 1;

            snprintf(pos, urlsz - outsz - rc + 1, "%s", urlbuf + rc + outsz);
            printf("Filter (%03d .. %03u): %s\n", rc, (unsigned int) (rc + outsz), dbg);
        }
    }

    printf("\n");
    printf("Result: ex = %d, ok = %d\n", ex, ok);
    printf("TimeComple: %6u.%06u seconds\n", cs / 1000000, cs % 1000000);
    printf("TimeSearch: %6u.%06u seconds\n", ss / 1000000, ss % 1000000);

    MAFSA_automaton_close(ma);

    return 0;
}